

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

U32 HUF_selectDecoder(size_t dstSize,size_t cSrcSize)

{
  int iVar1;
  uint uVar2;
  ulong in_RSI;
  ulong in_RDI;
  U32 DTime1;
  U32 DTime0;
  U32 D256;
  U32 Q;
  uint local_24;
  
  if (in_RDI == 0) {
    __assert_fail("dstSize > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x9317,"U32 HUF_selectDecoder(size_t, size_t)");
  }
  if (in_RDI < 0x20001) {
    if (in_RSI < in_RDI) {
      local_24 = (uint)((in_RSI << 4) / in_RDI);
    }
    else {
      local_24 = 0xf;
    }
    iVar1 = (int)(in_RDI >> 8);
    uVar2 = algoTime[local_24][1].tableTime + algoTime[local_24][1].decode256Time * iVar1;
    return (U32)((uVar2 >> 5) + uVar2 <
                algoTime[local_24][0].tableTime + algoTime[local_24][0].decode256Time * iVar1);
  }
  __assert_fail("dstSize <= 128*1024",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x9318,"U32 HUF_selectDecoder(size_t, size_t)");
}

Assistant:

U32 HUF_selectDecoder (size_t dstSize, size_t cSrcSize)
{
    assert(dstSize > 0);
    assert(dstSize <= 128*1024);
#if defined(HUF_FORCE_DECOMPRESS_X1)
    (void)dstSize;
    (void)cSrcSize;
    return 0;
#elif defined(HUF_FORCE_DECOMPRESS_X2)
    (void)dstSize;
    (void)cSrcSize;
    return 1;
#else
    /* decoder timing evaluation */
    {   U32 const Q = (cSrcSize >= dstSize) ? 15 : (U32)(cSrcSize * 16 / dstSize);   /* Q < 16 */
        U32 const D256 = (U32)(dstSize >> 8);
        U32 const DTime0 = algoTime[Q][0].tableTime + (algoTime[Q][0].decode256Time * D256);
        U32 DTime1 = algoTime[Q][1].tableTime + (algoTime[Q][1].decode256Time * D256);
        DTime1 += DTime1 >> 5;  /* small advantage to algorithm using less memory, to reduce cache eviction */
        return DTime1 < DTime0;
    }
#endif
}